

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Generators_Stratified1D_Test::TestBody(Generators_Stratified1D_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  char *message;
  char *in_R9;
  Float FVar6;
  undefined1 extraout_var [12];
  float fVar7;
  int count;
  int n;
  Stratified1DIter __begin1;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  undefined8 local_50;
  Stratified1DIter __end1;
  
  count = 0;
  local_60.ptr_._0_4_ = 0x80;
  local_58 = 0;
  n = 0x80;
  local_50 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)&local_60);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &local_60);
  iVar5 = 0;
  for (; __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
         super_IndexingIterator<pbrt::detail::Stratified1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
         super_IndexingIterator<pbrt::detail::Stratified1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
      super_IndexingIterator<pbrt::detail::Stratified1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
           super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1) {
    FVar6 = pbrt::detail::Stratified1DIter::operator*(&__begin1);
    fVar7 = (float)iVar5;
    iVar5 = iVar5 + 1;
    auVar3._4_12_ = extraout_var;
    auVar3._0_4_ = FVar6;
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)(fVar7 * 0.0078125)),auVar3,2);
    auVar4._4_12_ = extraout_var;
    auVar4._0_4_ = FVar6;
    uVar2 = vcmpps_avx512vl(auVar4,ZEXT416((uint)((float)iVar5 * 0.0078125)),1);
    gtest_ar_.success_ = (bool)((byte)uVar1 & (byte)uVar2 & 1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x46d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_98);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    count = iVar5;
  }
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"n","count",&n,&count);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x470,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Generators, Stratified1D) {
    int count = 0, n = 128;  // power of 2
    for (Float u : Stratified1D(n)) {
        EXPECT_TRUE(u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n));
        ++count;
    }
    EXPECT_EQ(n, count);
}